

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_2_5::maxEigenVector<Imath_2_5::Matrix44<double>,Imath_2_5::Vec4<double>>
               (Matrix44<double> *A,Vec4<double> *V)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  uint i;
  long lVar6;
  int iVar7;
  Vec4<double> S;
  Matrix44<double> MV;
  Vec4<double> local_a8;
  Matrix44<double> local_88;
  
  local_88.x[0][1] = 0.0;
  local_88.x[1][0] = 0.0;
  local_88.x[2][3] = 0.0;
  local_88.x[3][2] = 0.0;
  local_88.x[3][0] = 0.0;
  local_88.x[3][1] = 0.0;
  local_88.x[2][0] = 0.0;
  local_88.x[2][1] = 0.0;
  local_88.x[1][2] = 0.0;
  local_88.x[1][3] = 0.0;
  local_88.x[0][2] = 0.0;
  local_88.x[0][3] = 0.0;
  local_88.x[0][0] = 1.0;
  local_88.x[1][1] = 1.0;
  local_88.x[2][2] = 1.0;
  local_88.x[3][3] = 1.0;
  jacobiEigenSolver<double>(A,&local_a8,&local_88,2.220446049250313e-16);
  iVar7 = 0;
  lVar6 = 1;
  do {
    iVar5 = (int)lVar6;
    if (ABS((&local_a8.x)[lVar6]) <= ABS((&local_a8.x)[iVar7])) {
      iVar5 = iVar7;
    }
    iVar7 = iVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    puVar2 = (undefined4 *)((long)local_88.x[0] + lVar6 * 4 + (long)iVar7 * 8);
    uVar4 = puVar2[1];
    uVar3 = *(undefined8 *)((long)local_88.x[1] + lVar6 * 4 + (long)iVar7 * 8);
    puVar1 = (undefined4 *)((long)&V->x + lVar6);
    *puVar1 = *puVar2;
    puVar1[1] = uVar4;
    puVar1[2] = (int)uVar3;
    puVar1[3] = (int)((ulong)uVar3 >> 0x20);
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x20);
  return;
}

Assistant:

void
maxEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver(A, S, MV);

    int maxIdx(0);
    for(unsigned int i = 1; i < TV::dimensions(); ++i)
    {
        if(std::abs(S[i]) > std::abs(S[maxIdx]))
            maxIdx = i;
    }

    for(unsigned int i = 0; i < TV::dimensions(); ++i)
        V[i] = MV[i][maxIdx];
}